

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

size_t __thiscall YAML::detail::node_data::size(node_data *this)

{
  size_type sVar1;
  size_type sVar2;
  node_data *in_RDI;
  node_data *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe0;
  value vVar3;
  size_t local_8;
  
  if ((in_RDI->m_isDefined & 1U) == 0) {
    local_8 = 0;
  }
  else {
    vVar3 = in_RDI->m_type;
    if (vVar3 == Sequence) {
      compute_seq_size(in_RDI);
      local_8 = in_RDI->m_seqSize;
    }
    else if (vVar3 == Map) {
      compute_map_size(in_stack_00000010);
      sVar1 = std::
              vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
              ::size(&in_RDI->m_map);
      sVar2 = std::__cxx11::
              list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
              ::size((list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                      *)CONCAT44(vVar3,in_stack_ffffffffffffffe0));
      local_8 = sVar1 - sVar2;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

std::size_t node_data::size() const {
  if (!m_isDefined)
    return 0;

  switch (m_type) {
    case NodeType::Sequence:
      compute_seq_size();
      return m_seqSize;
    case NodeType::Map:
      compute_map_size();
      return m_map.size() - m_undefinedPairs.size();
    default:
      return 0;
  }
  return 0;
}